

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O2

int nn_xbus_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist_data *data;
  char *pcVar1;
  undefined8 uStack_30;
  int rcvprio;
  size_t sz;
  
  sz = 4;
  nn_pipe_getopt(pipe,0,9,&rcvprio,&sz);
  if (sz == 4) {
    if (0xffffffef < rcvprio - 0x11U) {
      data = (nn_dist_data *)nn_alloc_(0x38);
      if (data != (nn_dist_data *)0x0) {
        nn_fq_add((nn_fq *)&self[2].sock,(nn_fq_data *)(data + 1),pipe,rcvprio);
        nn_dist_add((nn_dist *)(self + 1),data,pipe);
        nn_pipe_setdata(pipe,data);
        return 0;
      }
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/bus/xbus.c"
              ,99);
      goto LAB_00124514;
    }
    nn_backtrace_print();
    pcVar1 = "rcvprio >= 1 && rcvprio <= 16";
    uStack_30 = 0x60;
  }
  else {
    nn_backtrace_print();
    pcVar1 = "sz == sizeof (rcvprio)";
    uStack_30 = 0x5f;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/bus/xbus.c"
          ,uStack_30);
LAB_00124514:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_xbus_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xbus *xbus;
    struct nn_xbus_data *data;
    int rcvprio;
    size_t sz;

    xbus = nn_cont (self, struct nn_xbus, sockbase);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xbus_data), "pipe data (xbus)");
    alloc_assert (data);
    nn_fq_add (&xbus->inpipes, &data->initem, pipe, rcvprio);
    nn_dist_add (&xbus->outpipes, &data->outitem, pipe);
    nn_pipe_setdata (pipe, data);

    return 0;
}